

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubcommandTest.cpp
# Opt level: O0

void __thiscall
TApp_EvilParseFallthrough_Test::~TApp_EvilParseFallthrough_Test
          (TApp_EvilParseFallthrough_Test *this)

{
  TApp_EvilParseFallthrough_Test *this_local;
  
  ~TApp_EvilParseFallthrough_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(TApp, EvilParseFallthrough) {
    app.fallthrough();
    int val1 = 0, val2 = 0;
    app.add_option("--val1", val1);

    auto sub = app.add_subcommand("sub");
    sub->add_option("val2", val2);

    args = {"sub", "--val1", "1", "2"};
    // Should not throw
    run();

    EXPECT_EQ(1, val1);
    EXPECT_EQ(2, val2);
}